

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_growth_policy.h
# Opt level: O0

size_t tsl::rh::power_of_two_growth_policy<2UL>::round_up_to_power_of_two(size_t value)

{
  bool bVar1;
  size_t in_RDI;
  size_t i;
  ulong local_18;
  ulong local_10;
  size_t local_8;
  
  bVar1 = is_power_of_two(in_RDI);
  local_8 = in_RDI;
  if (!bVar1) {
    if (in_RDI == 0) {
      local_8 = 1;
    }
    else {
      local_10 = in_RDI - 1;
      for (local_18 = 1; local_18 < 0x40; local_18 = local_18 << 1) {
        local_10 = local_10 >> ((byte)local_18 & 0x3f) | local_10;
      }
      local_8 = local_10 + 1;
    }
  }
  return local_8;
}

Assistant:

static std::size_t round_up_to_power_of_two(std::size_t value) {
    if (is_power_of_two(value)) {
      return value;
    }

    if (value == 0) {
      return 1;
    }

    --value;
    for (std::size_t i = 1; i < sizeof(std::size_t) * CHAR_BIT; i *= 2) {
      value |= value >> i;
    }

    return value + 1;
  }